

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPExternalTransmitter::~RTPExternalTransmitter(RTPExternalTransmitter *this)

{
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPExternalTransmitter_00145508;
  Destroy(this);
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  std::__cxx11::_List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
  _M_clear(&(this->rawpacketlist).
            super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>);
  return;
}

Assistant:

RTPExternalTransmitter::~RTPExternalTransmitter()
{
	Destroy();
}